

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

StreamOut * prvTidyUserOutput(TidyDocImpl *doc,TidyOutputSink *sink,int encoding,uint nl)

{
  TidyPutByteFunc p_Var1;
  StreamOut *pSVar2;
  
  pSVar2 = initStreamOut(doc,encoding,nl);
  p_Var1 = sink->putByte;
  (pSVar2->sink).sinkData = sink->sinkData;
  (pSVar2->sink).putByte = p_Var1;
  pSVar2->iotype = UserIO;
  return pSVar2;
}

Assistant:

StreamOut* TY_(UserOutput)( TidyDocImpl *doc, TidyOutputSink* sink, int encoding, uint nl )
{
    StreamOut* out = initStreamOut( doc, encoding, nl );
    memcpy( &out->sink, sink, sizeof(TidyOutputSink) );
    out->iotype = UserIO;
    return out;
}